

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImagePool::~CVmImagePool(CVmImagePool *this)

{
  ulong uVar1;
  ulong uVar2;
  
  (this->super_CVmPoolBackingStore)._vptr_CVmPoolBackingStore =
       (_func_int **)&PTR__CVmImagePool_0036e3b0;
  if (this->page_info_ != (CVmImagePool_pg **)0x0) {
    uVar1 = this->page_count_ + 0xfff;
    if (0xfff < uVar1) {
      uVar2 = 0;
      do {
        free(this->page_info_[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar1 >> 0xc != uVar2);
    }
    free(this->page_info_);
    return;
  }
  return;
}

Assistant:

CVmImagePool::~CVmImagePool()
{
    /* if we allocated a set of page offset arrays, delete them */
    if (page_info_ != 0)
    {
        size_t i;
        size_t cnt;

        /* compute the number of subarrays we have */
        cnt = get_subarray_count();

        /* delete each subarray */
        for (i = 0 ; i < cnt ; ++i)
            t3free(page_info_[i]);

        /* delete the master array */
        t3free(page_info_);
    }
}